

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void save_food(memfile *mf)

{
  uint local_20;
  uint local_1c;
  uint vflags;
  uint oid;
  memfile *mf_local;
  
  if (victual.piece == (obj *)0x0) {
    local_1c = 0;
  }
  else {
    local_1c = (victual.piece)->o_id;
  }
  mwrite32(mf,local_1c);
  mwrite32(mf,victual.usedtime);
  mwrite32(mf,victual.reqtime);
  mwrite32(mf,victual.nmod);
  mwrite32(mf,(uint)(victual._20_1_ & 1) << 0x1f | (uint)((byte)victual._20_1_ >> 1 & 1) << 0x1e |
              (uint)((byte)victual._20_1_ >> 2 & 1) << 0x1d |
              (uint)((byte)victual._20_1_ >> 3 & 1) << 0x1c);
  if (tin.tin == (obj *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = (tin.tin)->o_id;
  }
  mwrite32(mf,local_20);
  mwrite32(mf,tin.usedtime);
  mwrite32(mf,tin.reqtime);
  return;
}

Assistant:

void save_food(struct memfile *mf)
{
    unsigned int oid, vflags;

    /* no mtag useful; fixed distance after track */

    oid = victual.piece ? victual.piece->o_id : 0;
    mwrite32(mf, oid);
    mwrite32(mf, victual.usedtime);
    mwrite32(mf, victual.reqtime);
    mwrite32(mf, victual.nmod);

    vflags = (victual.canchoke << 31) | (victual.fullwarn << 30) |
             (victual.eating << 29) | (victual.doreset << 28);
    mwrite32(mf, vflags);

    oid = tin.tin ? tin.tin->o_id : 0;
    mwrite32(mf, oid);
    mwrite32(mf, tin.usedtime);
    mwrite32(mf, tin.reqtime);
}